

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

double sqlite3VdbeRealValue(Mem *pMem)

{
  ushort uVar1;
  double val;
  double local_10;
  
  uVar1 = pMem->flags;
  if ((uVar1 & 8) != 0) {
    return pMem->r;
  }
  if ((uVar1 & 4) == 0) {
    if ((uVar1 & 0x12) != 0) {
      local_10 = 0.0;
      sqlite3AtoF(pMem->z,&local_10,pMem->n,pMem->enc);
      return local_10;
    }
    return 0.0;
  }
  return (double)(pMem->u).i;
}

Assistant:

SQLITE_PRIVATE double sqlite3VdbeRealValue(Mem *pMem){
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  if( pMem->flags & MEM_Real ){
    return pMem->r;
  }else if( pMem->flags & MEM_Int ){
    return (double)pMem->u.i;
  }else if( pMem->flags & (MEM_Str|MEM_Blob) ){
    /* (double)0 In case of SQLITE_OMIT_FLOATING_POINT... */
    double val = (double)0;
    sqlite3AtoF(pMem->z, &val, pMem->n, pMem->enc);
    return val;
  }else{
    /* (double)0 In case of SQLITE_OMIT_FLOATING_POINT... */
    return (double)0;
  }
}